

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int Curl_hash_init(curl_hash *h,int slots,hash_function hfunc,comp_function comparator,
                  curl_hash_dtor dtor)

{
  curl_llist *pcVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 1;
  if ((dtor != (curl_hash_dtor)0x0 && comparator != (comp_function)0x0) &&
      (hfunc != (hash_function)0x0 && slots != 0)) {
    h->hash_func = hfunc;
    h->comp_func = comparator;
    h->dtor = dtor;
    h->size = 0;
    h->slots = slots;
    pcVar1 = (curl_llist *)(*Curl_cmalloc)((long)slots << 5);
    h->table = pcVar1;
    if (pcVar1 == (curl_llist *)0x0) {
      h->slots = 0;
    }
    else if (slots < 1) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      lVar2 = 0;
      do {
        Curl_llist_init((curl_llist *)((long)&h->table->head + lVar2),hash_element_dtor);
        lVar2 = lVar2 + 0x20;
      } while ((ulong)(uint)slots << 5 != lVar2);
    }
  }
  return iVar3;
}

Assistant:

int
Curl_hash_init(struct curl_hash *h,
               int slots,
               hash_function hfunc,
               comp_function comparator,
               curl_hash_dtor dtor)
{
  if(!slots || !hfunc || !comparator ||!dtor) {
    return 1; /* failure */
  }

  h->hash_func = hfunc;
  h->comp_func = comparator;
  h->dtor = dtor;
  h->size = 0;
  h->slots = slots;

  h->table = malloc(slots * sizeof(struct curl_llist));
  if(h->table) {
    int i;
    for(i = 0; i < slots; ++i)
      Curl_llist_init(&h->table[i], (curl_llist_dtor) hash_element_dtor);
    return 0; /* fine */
  }
  h->slots = 0;
  return 1; /* failure */
}